

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::ChineseCalendar::newMoonNear(ChineseCalendar *this,double days,UBool after)

{
  CalendarAstronomer *pCVar1;
  undefined7 in_register_00000031;
  size_t size;
  double dVar2;
  CalendarAstronomer *local_60;
  MoonAge local_50;
  double local_48;
  UDate newMoon;
  undefined1 local_29;
  CalendarAstronomer *local_28;
  UBool local_19;
  double dStack_18;
  UBool after_local;
  double days_local;
  ChineseCalendar *this_local;
  
  size = CONCAT71(in_register_00000031,after);
  local_19 = after;
  dStack_18 = days;
  days_local = (double)this;
  umtx_lock_63(&astroLock);
  if (gChineseCalendarAstro == (CalendarAstronomer *)0x0) {
    pCVar1 = (CalendarAstronomer *)UMemory::operator_new((UMemory *)0x88,size);
    local_29 = 0;
    local_60 = (CalendarAstronomer *)0x0;
    if (pCVar1 != (CalendarAstronomer *)0x0) {
      local_29 = 1;
      local_28 = pCVar1;
      CalendarAstronomer::CalendarAstronomer(pCVar1);
      local_60 = pCVar1;
    }
    gChineseCalendarAstro = local_60;
    ucln_i18n_registerCleanup_63(UCLN_I18N_CHINESE_CALENDAR,calendar_chinese_cleanup);
  }
  pCVar1 = gChineseCalendarAstro;
  dVar2 = daysToMillis(this,dStack_18);
  CalendarAstronomer::setTime(pCVar1,dVar2);
  pCVar1 = gChineseCalendarAstro;
  local_50 = CalendarAstronomer::NEW_MOON();
  local_48 = CalendarAstronomer::getMoonTime(pCVar1,&local_50,local_19);
  umtx_unlock_63(&astroLock);
  dVar2 = millisToDays(this,local_48);
  return (int)dVar2;
}

Assistant:

int32_t ChineseCalendar::newMoonNear(double days, UBool after) const {
    
    umtx_lock(&astroLock);
    if(gChineseCalendarAstro == NULL) {
        gChineseCalendarAstro = new CalendarAstronomer();
        ucln_i18n_registerCleanup(UCLN_I18N_CHINESE_CALENDAR, calendar_chinese_cleanup);
    }
    gChineseCalendarAstro->setTime(daysToMillis(days));
    UDate newMoon = gChineseCalendarAstro->getMoonTime(CalendarAstronomer::NEW_MOON(), after);
    umtx_unlock(&astroLock);
    
    return (int32_t) millisToDays(newMoon);
}